

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

bool glslang::OutputSpvBin
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,char *baseName)

{
  uint uVar1;
  pointer puVar2;
  long lVar3;
  uint word;
  ofstream out;
  uint local_22c;
  long local_228;
  filebuf local_220 [24];
  uint auStack_208 [54];
  ios_base local_130 [264];
  
  std::ofstream::ofstream((ofstream *)&local_228);
  std::ofstream::open((char *)&local_228,(_Ios_Openmode)baseName);
  uVar1 = *(uint *)((long)auStack_208 + *(long *)(local_228 + -0x18));
  if ((uVar1 & 5) == 0) {
    puVar2 = (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(spirv->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2)) {
      lVar3 = 0;
      do {
        local_22c = puVar2[lVar3];
        std::ostream::write((char *)&local_228,(long)&local_22c);
        lVar3 = lVar3 + 1;
        puVar2 = (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar3 < (int)((ulong)((long)(spirv->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar2) >> 2));
    }
    std::ofstream::close();
  }
  else {
    printf("ERROR: Failed to open file: %s\n",baseName);
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = __M_insert<long>;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return (uVar1 & 5) == 0;
}

Assistant:

bool OutputSpvBin(const std::vector<unsigned int>& spirv, const char* baseName)
{
    std::ofstream out;
    out.open(baseName, std::ios::binary | std::ios::out);
    if (out.fail()) {
        printf("ERROR: Failed to open file: %s\n", baseName);
        return false;
    }
    for (int i = 0; i < (int)spirv.size(); ++i) {
        unsigned int word = spirv[i];
        out.write((const char*)&word, 4);
    }
    out.close();
    return true;
}